

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O1

exr_result_t exr_attr_string_vector_destroy(exr_context_t ctxt,exr_attr_string_vector_t *sv)

{
  exr_attr_string_t *peVar1;
  exr_result_t eVar2;
  long lVar3;
  exr_attr_string_t *s;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = 0;
    if (sv != (exr_attr_string_vector_t *)0x0) {
      if (0 < sv->alloc_size) {
        peVar1 = sv->strings;
        if (0 < sv->n_strings) {
          lVar3 = 0;
          s = peVar1;
          do {
            exr_attr_string_destroy(ctxt,s);
            lVar3 = lVar3 + 1;
            s = s + 1;
          } while (lVar3 < sv->n_strings);
        }
        if (peVar1 != (exr_attr_string_t *)0x0) {
          (**(code **)(ctxt + 0x60))(peVar1);
        }
      }
      sv->n_strings = 0;
      sv->alloc_size = 0;
      sv->strings = (exr_attr_string_t *)0x0;
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_string_vector_destroy (
    exr_context_t ctxt, exr_attr_string_vector_t* sv)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sv)
    {
        exr_attr_string_vector_t nil = {0};
        if (sv->alloc_size > 0)
        {
            exr_attr_string_t* strs =
                EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
            for (int32_t i = 0; i < sv->n_strings; ++i)
                exr_attr_string_destroy (ctxt, strs + i);
            if (strs) pctxt->free_fn (strs);
        }
        *sv = nil;
    }
    return EXR_ERR_SUCCESS;
}